

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O2

SQInteger __thiscall SQFuncState::PopTarget(SQFuncState *this)

{
  long lVar1;
  SQUnsignedInteger SVar2;
  
  SVar2 = (this->_targetstack)._size;
  lVar1 = (this->_targetstack)._vals[SVar2 - 1];
  if ((this->_vlocals)._vals[lVar1]._name.super_SQObject._type == OT_NULL) {
    sqvector<SQLocalVarInfo>::pop_back(&this->_vlocals);
    SVar2 = (this->_targetstack)._size;
  }
  (this->_targetstack)._size = SVar2 - 1;
  return lVar1;
}

Assistant:

SQInteger SQFuncState::PopTarget()
{
    SQUnsignedInteger npos=_targetstack.back();
    assert(npos < _vlocals.size());
    SQLocalVarInfo &t = _vlocals[npos];
    if(sq_type(t._name)==OT_NULL){
        _vlocals.pop_back();
    }
    _targetstack.pop_back();
    return npos;
}